

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O1

vector<void_*,_std::allocator<void_*>_> *
eglu::chooseConfigs(vector<void_*,_std::allocator<void_*>_> *__return_storage_ptr__,Library *egl,
                   EGLDisplay display,FilterList *filters)

{
  pointer *pppvVar1;
  iterator __position;
  bool bVar2;
  pointer __args;
  vector<void_*,_std::allocator<void_*>_> allConfigs;
  vector<void_*,_std::allocator<void_*>_> local_48;
  
  getConfigs(&local_48,egl,display);
  (__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __args = local_48.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_48.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      bVar2 = FilterList::match(filters,egl,display,*__args);
      if (bVar2) {
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
                    ((vector<void*,std::allocator<void*>> *)__return_storage_ptr__,__position,__args
                    );
        }
        else {
          *__position._M_current = *__args;
          pppvVar1 = &(__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppvVar1 = *pppvVar1 + 1;
        }
      }
      __args = __args + 1;
    } while (__args != local_48.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  if (local_48.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (void **)0x0) {
    operator_delete(local_48.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<EGLConfig> chooseConfigs (const Library& egl, EGLDisplay display, const FilterList& filters)
{
	const vector<EGLConfig>	allConfigs		(getConfigs(egl, display));
	vector<EGLConfig>		matchingConfigs;

	for (vector<EGLConfig>::const_iterator cfg = allConfigs.begin(); cfg != allConfigs.end(); ++cfg)
	{
		if (filters.match(egl, display, *cfg))
			matchingConfigs.push_back(*cfg);
	}

	return matchingConfigs;
}